

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O2

Output_GetCameraWindowSize * __thiscall
ViconDataStreamSDK::CPP::Client::GetCameraWindowSize
          (Output_GetCameraWindowSize *__return_storage_ptr__,Client *this,string *i_rCameraName)

{
  Enum i_Result;
  Enum EVar1;
  
  i_Result = Core::VClient::GetCameraWindowSize
                       ((this->m_pClientImpl->m_pCoreClient).
                        super___shared_ptr<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,i_rCameraName,&__return_storage_ptr__->WindowStartX,
                        &__return_storage_ptr__->WindowStartY,&__return_storage_ptr__->WindowWidth,
                        &__return_storage_ptr__->WindowHeight);
  EVar1 = Adapt(i_Result);
  __return_storage_ptr__->Result = EVar1;
  return __return_storage_ptr__;
}

Assistant:

CLASS_DECLSPEC
  Output_GetCameraWindowSize Client::GetCameraWindowSize( const std::string & i_rCameraName ) const
  {
    Output_GetCameraWindowSize Output;
    Output.Result = Adapt(m_pClientImpl->m_pCoreClient->GetCameraWindowSize(
      i_rCameraName,
      Output.WindowStartX,
      Output.WindowStartY,
      Output.WindowWidth,
      Output.WindowHeight ));

    return Output;
  }